

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# which.cpp
# Opt level: O0

string * fs_which_abi_cxx11_(string *__return_storage_ptr__,string_view name,string_view path,
                            bool find_all)

{
  string_view path_00;
  string_view name_00;
  string_view path_01;
  string_view path_02;
  bool bVar1;
  error_code eVar2;
  error_code local_78;
  string_view local_68;
  size_t local_58;
  char *local_50;
  size_t local_48;
  size_t local_40;
  byte local_31;
  undefined1 auStack_30 [7];
  bool find_all_local;
  string_view path_local;
  string_view name_local;
  
  path_local._M_len = (size_t)path._M_str;
  _auStack_30 = path._M_len;
  path_local._M_str = (char *)name._M_len;
  local_31 = find_all;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30);
  if (!bVar1) {
    local_48 = _auStack_30;
    local_40 = path_local._M_len;
    path_02._M_str = (char *)path_local._M_len;
    path_02._M_len = _auStack_30;
    bVar1 = fs_is_dir(path_02);
    if (!bVar1) {
      local_58 = _auStack_30;
      local_50 = (char *)path_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"fs_which")
      ;
      eVar2 = std::make_error_code(not_a_directory);
      local_78._M_cat = eVar2._M_cat;
      local_78._M_value = eVar2._M_value;
      path_01._M_str = local_50;
      path_01._M_len = local_58;
      fs_print_error(path_01,local_68,&local_78);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  name_00._M_str = name._M_str;
  name_00._M_len = (size_t)path_local._M_str;
  path_00._M_str = (char *)path_local._M_len;
  path_00._M_len = _auStack_30;
  fs_which_generic_abi_cxx11_(__return_storage_ptr__,name_00,path_00,(bool)(local_31 & 1));
  return __return_storage_ptr__;
}

Assistant:

std::string fs_which(std::string_view name, std::string_view path, const bool find_all)
{
  // find an executable file "name" under each path in
  // environment variable PATH or "path" if specified

  if (!path.empty() && !fs_is_dir(path)){
    fs_print_error(path, __func__, std::make_error_code(std::errc::not_a_directory));
    return {};
  }

#if defined(_WIN32)
  // use SearchPathA, even though the generic method works.
  // This is because SearchPathA uses registry preferences that the generic method ignores.

  if(find_all)
    return fs_which_generic(name, path, true);

  std::string r(fs_get_max_path(), '\0');
  DWORD L;

  // https://learn.microsoft.com/en-us/windows/win32/api/processenv/nf-processenv-searchpatha
  if (path.empty())
    L = SearchPathA(nullptr, name.data(), ".exe", static_cast<DWORD>(r.length()), r.data(), nullptr);
  else
    L = SearchPathA(path.data(), name.data(), ".exe", static_cast<DWORD>(r.length()), r.data(), nullptr);

  if(L == 0 && GetLastError() == ERROR_FILE_NOT_FOUND)
    return {};

  if(L == 0 || L >= r.length()){
    fs_print_error(name, __func__);
    return {};
  }
  r.resize(L);

  if(fs_trace) std::cout << "TRACE: which: SearchPathA: " << r << "  length " << L << "\n";
  if(!fs_is_exe(r))
    return {};

  return fs_as_posix(r);

#else
  return fs_which_generic(name, path, find_all);
#endif
}